

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O3

ma_result ma_channel_converter_get_heap_layout
                    (ma_channel_converter_config *pConfig,
                    ma_channel_converter_heap_layout *pHeapLayout)

{
  uint channels;
  uint channels_00;
  ma_channel *pChannelMap;
  ma_channel *pChannelMap_00;
  ma_bool32 mVar1;
  ma_channel_conversion_path mVar2;
  size_t sVar3;
  ma_result mVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  
  mVar4 = MA_INVALID_ARGS;
  if (pConfig != (ma_channel_converter_config *)0x0) {
    channels = pConfig->channelsIn;
    uVar6 = (ulong)channels;
    if (uVar6 != 0) {
      channels_00 = pConfig->channelsOut;
      uVar7 = (ulong)channels_00;
      if (uVar7 != 0) {
        pChannelMap = pConfig->pChannelMapIn;
        mVar1 = ma_channel_map_is_valid(pChannelMap,channels);
        if (mVar1 != 0) {
          pChannelMap_00 = pConfig->pChannelMapOut;
          mVar1 = ma_channel_map_is_valid(pChannelMap_00,channels_00);
          if (mVar1 != 0) {
            pHeapLayout->channelMapInOffset = 0;
            sVar3 = uVar6;
            if (pChannelMap == (ma_channel *)0x0) {
              sVar3 = 0;
            }
            pHeapLayout->channelMapOutOffset = sVar3;
            uVar5 = uVar7;
            if (pChannelMap_00 == (ma_channel *)0x0) {
              uVar5 = 0;
            }
            uVar5 = sVar3 + uVar5 + 7 & 0x3fffffff8;
            pHeapLayout->sizeInBytes = uVar5;
            mVar2 = ma_channel_map_get_conversion_path
                              (pChannelMap,channels,pChannelMap_00,channels_00,pConfig->mixingMode);
            pHeapLayout->shuffleTableOffset = uVar5;
            if (mVar2 == ma_channel_conversion_path_shuffle) {
              uVar5 = uVar5 + uVar7;
              pHeapLayout->weightsOffset = uVar5;
            }
            else {
              pHeapLayout->weightsOffset = uVar5;
              if (mVar2 == ma_channel_conversion_path_weights) {
                uVar5 = uVar5 + (uVar7 * 4 + 8) * uVar6;
              }
            }
            pHeapLayout->sizeInBytes = uVar5 + 7 & 0xfffffffffffffff8;
            mVar4 = MA_SUCCESS;
          }
        }
      }
    }
  }
  return mVar4;
}

Assistant:

static ma_result ma_channel_converter_get_heap_layout(const ma_channel_converter_config* pConfig, ma_channel_converter_heap_layout* pHeapLayout)
{
    ma_channel_conversion_path conversionPath;

    MA_ASSERT(pHeapLayout != NULL);

    if (pConfig == NULL) {
        return MA_INVALID_ARGS;
    }

    if (pConfig->channelsIn == 0 || pConfig->channelsOut == 0) {
        return MA_INVALID_ARGS;
    }

    if (!ma_channel_map_is_valid(pConfig->pChannelMapIn, pConfig->channelsIn)) {
        return MA_INVALID_ARGS;
    }

    if (!ma_channel_map_is_valid(pConfig->pChannelMapOut, pConfig->channelsOut)) {
        return MA_INVALID_ARGS;
    }

    pHeapLayout->sizeInBytes = 0;

    /* Input channel map. Only need to allocate this if we have an input channel map (otherwise default channel map is assumed). */
    pHeapLayout->channelMapInOffset = pHeapLayout->sizeInBytes;
    if (pConfig->pChannelMapIn != NULL) {
        pHeapLayout->sizeInBytes += sizeof(ma_channel) * pConfig->channelsIn;
    }

    /* Output channel map. Only need to allocate this if we have an output channel map (otherwise default channel map is assumed). */
    pHeapLayout->channelMapOutOffset = pHeapLayout->sizeInBytes;
    if (pConfig->pChannelMapOut != NULL) {
        pHeapLayout->sizeInBytes += sizeof(ma_channel) * pConfig->channelsOut;
    }

    /* Alignment for the next section. */
    pHeapLayout->sizeInBytes = ma_align_64(pHeapLayout->sizeInBytes);

    /* Whether or not we use weights of a shuffle table depends on the channel map themselves and the algorithm we've chosen. */
    conversionPath = ma_channel_converter_config_get_conversion_path(pConfig);

    /* Shuffle table */
    pHeapLayout->shuffleTableOffset = pHeapLayout->sizeInBytes;
    if (conversionPath == ma_channel_conversion_path_shuffle) {
        pHeapLayout->sizeInBytes += sizeof(ma_uint8) * pConfig->channelsOut;
    }

    /* Weights */
    pHeapLayout->weightsOffset = pHeapLayout->sizeInBytes;
    if (conversionPath == ma_channel_conversion_path_weights) {
        pHeapLayout->sizeInBytes += sizeof(float*) * pConfig->channelsIn;
        pHeapLayout->sizeInBytes += sizeof(float ) * pConfig->channelsIn * pConfig->channelsOut;
    }

    /* Make sure allocation size is aligned. */
    pHeapLayout->sizeInBytes = ma_align_64(pHeapLayout->sizeInBytes);

    return MA_SUCCESS;
}